

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<188UL> *
mserialize::cx_strcat<1ul,100ul,86ul,1ul>
          (cx_string<1UL> *strings,cx_string<100UL> *strings_1,cx_string<86UL> *strings_2,
          cx_string<1UL> *strings_3)

{
  cx_string<86UL> *in_RCX;
  cx_string<100UL> *in_RDX;
  cx_string<1UL> *in_RSI;
  cx_string<188UL> *in_RDI;
  cx_string<1UL> *in_R8;
  size_t s;
  size_t i;
  char *out;
  size_t size [5];
  char *data [5];
  char buffer [189];
  char *in_stack_fffffffffffffea0;
  ulong local_158;
  char *local_150;
  size_t local_140 [5];
  char *local_118;
  data_ref local_110;
  data_ref local_108;
  data_ref local_100;
  data_ref local_f8;
  char local_e8 [200];
  cx_string<1UL> *local_20;
  cx_string<86UL> *local_18;
  cx_string<100UL> *local_10;
  cx_string<1UL> *local_8;
  
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_e8,0,0xbd);
  local_118 = "";
  local_110 = cx_string<1UL>::data(local_8);
  local_108 = cx_string<100UL>::data(local_10);
  local_100 = cx_string<86UL>::data(local_18);
  local_f8 = cx_string<1UL>::data(local_20);
  local_140[0] = cx_string<1UL>::size(local_8);
  local_140[1] = cx_string<100UL>::size(local_10);
  local_140[2] = cx_string<86UL>::size(local_18);
  local_140[3] = cx_string<1UL>::size(local_20);
  local_150 = local_e8;
  for (local_158 = 1; local_158 < 5; local_158 = local_158 + 1) {
    for (in_stack_fffffffffffffea0 = (char *)0x0;
        in_stack_fffffffffffffea0 < (cx_string<188UL> *)local_140[local_158 - 1];
        in_stack_fffffffffffffea0 = in_stack_fffffffffffffea0 + 1) {
      *local_150 = in_stack_fffffffffffffea0[(long)(&local_118)[local_158]];
      local_150 = local_150 + 1;
    }
  }
  cx_string<188UL>::cx_string((cx_string<188UL> *)in_stack_fffffffffffffea0,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}